

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

void __thiscall
Diligent::DearchiverBase::UnpackRenderPass
          (DearchiverBase *this,RenderPassUnpackInfo *UnpackInfo,IRenderPass **ppRP)

{
  bool bVar1;
  ArchiveData *pAVar2;
  char (*in_RCX) [30];
  RPData RP;
  undefined1 local_88 [32];
  IMemoryAllocator *local_68;
  RenderPassDesc local_60;
  
  *ppRP = (IRenderPass *)0x0;
  if (UnpackInfo->pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[30]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"UnpackInfo.pDevice != nullptr",in_RCX);
    in_RCX = (char (*) [30])0x33e;
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"UnpackRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x33e);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  if ((UnpackInfo->ModifyRenderPassDesc == (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) &&
     (in_RCX = (char (*) [30])ppRP,
     bVar1 = NamedResourceCache<Diligent::IRenderPass>::Get
                       (&(this->m_Cache).RenderPass,RenderPass,UnpackInfo->Name,ppRP), bVar1)) {
    return;
  }
  pAVar2 = FindArchive(this,RenderPass,UnpackInfo->Name);
  if (pAVar2 != (ArchiveData *)0x0) {
    if ((pAVar2->pObjArchive)._M_t.
        super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
        .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl ==
        (DeviceObjectArchive *)0x0) {
      FormatString<char[26],char[12]>
                ((string *)local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"pObjArchive",(char (*) [12])in_RCX);
      DebugAssertionFailed
                ((Char *)local_88._0_8_,"UnpackRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                 ,0x34e);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    }
    local_68 = GetRawAllocator();
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = 0;
    local_88._24_4_ = 0x400;
    local_60.super_DeviceObjectAttribs.Name = (Char *)0x0;
    local_60.AttachmentCount = 0;
    local_60.pAttachments = (RenderPassAttachmentDesc *)0x0;
    local_60.SubpassCount = 0;
    local_60.pSubpasses = (SubpassDesc *)0x0;
    local_60.DependencyCount = 0;
    local_60.pDependencies = (SubpassDependencyDesc *)0x0;
    bVar1 = DeviceObjectArchive::LoadResourceCommonData<Diligent::DearchiverBase::RPData>
                      ((pAVar2->pObjArchive)._M_t.
                       super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                       .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                       _M_head_impl,RenderPass,UnpackInfo->Name,(RPData *)local_88);
    if (bVar1) {
      if (UnpackInfo->ModifyRenderPassDesc != (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) {
        (*UnpackInfo->ModifyRenderPassDesc)(&local_60,UnpackInfo->pUserData);
      }
      (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0xf])(UnpackInfo->pDevice,&local_60,ppRP)
      ;
      if (UnpackInfo->ModifyRenderPassDesc == (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) {
        NamedResourceCache<Diligent::IRenderPass>::Set
                  (&(this->m_Cache).RenderPass,RenderPass,UnpackInfo->Name,*ppRP);
      }
    }
    DynamicLinearAllocator::~DynamicLinearAllocator((DynamicLinearAllocator *)local_88);
  }
  return;
}

Assistant:

void DearchiverBase::UnpackRenderPass(const RenderPassUnpackInfo& UnpackInfo, IRenderPass** ppRP)
{
    if (!VerifyRenderPassUnpackInfo(UnpackInfo, ppRP))
        return;

    *ppRP = nullptr;

    VERIFY_EXPR(UnpackInfo.pDevice != nullptr);
    // Do not cache modified render passes.
    if (UnpackInfo.ModifyRenderPassDesc == nullptr)
    {
        // Since render pass names must be unique, we use a single cache for all
        // loaded archives.
        if (m_Cache.RenderPass.Get(RPData::ArchiveResType, UnpackInfo.Name, ppRP))
            return;
    }

    // Find the archive that contains this render pass.
    ArchiveData* pArchiveData = FindArchive(RPData::ArchiveResType, UnpackInfo.Name);
    if (pArchiveData == nullptr)
        return;

    const auto& pObjArchive = pArchiveData->pObjArchive;
    VERIFY_EXPR(pObjArchive);

    RPData RP{GetRawAllocator()};
    if (!pArchiveData->pObjArchive->LoadResourceCommonData(RPData::ArchiveResType, UnpackInfo.Name, RP))
        return;

    if (UnpackInfo.ModifyRenderPassDesc != nullptr)
        UnpackInfo.ModifyRenderPassDesc(RP.Desc, UnpackInfo.pUserData);

    UnpackInfo.pDevice->CreateRenderPass(RP.Desc, ppRP);

    if (UnpackInfo.ModifyRenderPassDesc == nullptr)
        m_Cache.RenderPass.Set(RPData::ArchiveResType, UnpackInfo.Name, *ppRP);
}